

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_get_rows_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  undefined8 in_RDI;
  ggml_tensor *result;
  ggml_type type;
  
  type = (ggml_type)((ulong)in_RDI >> 0x20);
  _Var1 = ggml_is_matrix(in_RSI);
  if (((_Var1) && (_Var1 = ggml_is_vector(in_RDX), _Var1)) && (in_RDX->type == GGML_TYPE_I32)) {
    _Var1 = ggml_is_matrix(in_RCX);
    if ((_Var1) && (in_RSI->ne[0] == in_RCX->ne[0])) {
      pgVar2 = ggml_new_tensor_2d((ggml_context *)result,type,(int64_t)in_RSI,(int64_t)in_RDX);
      pgVar2->op = GGML_OP_GET_ROWS_BACK;
      pgVar2->src[0] = in_RSI;
      pgVar2->src[1] = in_RDX;
      return pgVar2;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xd19,"GGML_ASSERT(%s) failed","ggml_is_matrix(c) && (a->ne[0] == c->ne[0])");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             0xd18,"GGML_ASSERT(%s) failed",
             "ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32");
}

Assistant:

struct ggml_tensor * ggml_get_rows_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c) {
    GGML_ASSERT(ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32);
    GGML_ASSERT(ggml_is_matrix(c) && (a->ne[0] == c->ne[0]));

    // TODO: implement non F32 return
    //struct ggml_tensor * result = ggml_new_tensor_2d(ctx, a->type, a->ne[0], b->ne[0]);
    struct ggml_tensor * result = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, c->ne[0], c->ne[1]);

    result->op     = GGML_OP_GET_ROWS_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}